

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O2

Matrix2f __thiscall Matrix3f::getSubmatrix2x2(Matrix3f *this,int i0,int j0)

{
  float fVar1;
  float *pfVar2;
  int in_ECX;
  undefined4 in_register_00000034;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  int j;
  long lVar6;
  ulong extraout_XMM0_Qa;
  ulong uVar7;
  undefined8 in_XMM1_Qa;
  Matrix2f MVar8;
  
  Matrix2f::Matrix2f((Matrix2f *)this,0.0);
  pfVar3 = (float *)((long)in_ECX * 0xc + (long)j0 * 4 + CONCAT44(in_register_00000034,i0));
  uVar7 = extraout_XMM0_Qa;
  for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
    pfVar4 = pfVar3;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      fVar1 = *pfVar4;
      pfVar2 = Matrix2f::operator()((Matrix2f *)this,(int)lVar5,(int)lVar6);
      uVar7 = (ulong)(uint)fVar1;
      *pfVar2 = fVar1;
      pfVar4 = pfVar4 + 3;
    }
    pfVar3 = pfVar3 + 1;
  }
  MVar8.m_elements[2] = (float)(int)in_XMM1_Qa;
  MVar8.m_elements[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  MVar8.m_elements[0] = (float)(int)uVar7;
  MVar8.m_elements[1] = (float)(int)(uVar7 >> 0x20);
  return (Matrix2f)MVar8.m_elements;
}

Assistant:

Matrix2f Matrix3f::getSubmatrix2x2( int i0, int j0 ) const
{
	Matrix2f out;

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			out( i, j ) = ( *this )( i + i0, j + j0 );
		}
	}

	return out;
}